

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void __thiscall vmbt_mt_ifc::put_state_buf(vmbt_mt_ifc *this,char *buf)

{
  CVmMT19937 *pCVar1;
  int i;
  long lVar2;
  
  pCVar1 = this->mt;
  pCVar1->idx = (uint)*(ushort *)buf + ((*(ushort *)buf >> 4) / 0x27) * -0x270 & 0xffff;
  lVar2 = 0;
  do {
    pCVar1->mt[lVar2] = *(uint32_t *)(buf + lVar2 * 4 + 2);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  return;
}

Assistant:

virtual void put_state_buf(const char *buf) { mt->put_state(buf); }